

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSearchBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *pvVar1;
  LogicalType *type;
  LogicalTypeId LVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  undefined1 auVar6 [8];
  element_type *peVar7;
  undefined8 uVar8;
  bool bVar9;
  reference pvVar10;
  pointer pEVar11;
  pointer pEVar12;
  reference pvVar13;
  LogicalType *pLVar14;
  LogicalType *left;
  undefined8 *puVar15;
  BinderException *this_00;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  LogicalType max_child_type;
  undefined1 local_e0 [8];
  undefined8 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  LogicalType local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  local_c0._M_allocated_capacity =
       (size_type)
       (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_e0,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_c0._M_allocated_capacity);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  auVar6 = local_e0;
  local_e0 = (undefined1  [8])0x0;
  _Var3._M_head_impl =
       (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar6;
  if (_Var3._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_e0 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_e0 + 8))();
  }
  local_e0 = (undefined1  [8])0x0;
  if ((Expression *)local_c0._M_allocated_capacity != (Expression *)0x0) {
    (**(code **)(*(long *)local_c0._M_allocated_capacity + 8))();
  }
  local_c0._M_allocated_capacity = 0;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  pLVar14 = &pEVar12->return_type;
  LVar2 = (pEVar12->return_type).id_;
  if ((pEVar11->return_type).id_ == UNKNOWN) {
    if (LVar2 == UNKNOWN) goto LAB_00910dfe;
    LogicalType::LIST((LogicalType *)local_e0,pLVar14);
    pvVar1 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar13 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,0);
    uVar8 = aStack_d0._M_allocated_capacity;
    peVar7 = local_d8;
    pvVar13->id_ = (LogicalTypeId)local_e0[0];
    pvVar13->physical_type_ = local_e0[1];
    uVar16 = *(undefined4 *)
              &(pvVar13->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar17 = *(undefined4 *)
              ((long)&(pvVar13->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar18 = *(undefined4 *)
              &(pvVar13->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar19 = *(undefined4 *)
              ((long)&(pvVar13->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar13->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar13->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8 = (element_type *)0x0;
    aStack_d0._M_allocated_capacity = 0;
    p_Var4 = (pvVar13->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar13->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    (pvVar13->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_c0._8_4_ = uVar16;
      local_c0._12_4_ = uVar17;
      uStack_b0 = uVar18;
      uStack_ac = uVar19;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      uVar16 = local_c0._8_4_;
      uVar17 = local_c0._12_4_;
      uVar18 = uStack_b0;
      uVar19 = uStack_ac;
    }
    uVar8 = aStack_d0._M_allocated_capacity;
    local_d8 = (element_type *)CONCAT44(uVar17,uVar16);
    aStack_d0._M_allocated_capacity._4_4_ = uVar19;
    aStack_d0._M_allocated_capacity._0_4_ = uVar18;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
    }
    LogicalType::~LogicalType((LogicalType *)local_e0);
    pvVar13 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,1);
    if (pvVar13 == pLVar14) goto LAB_00910dfe;
    pvVar13->id_ = (pEVar12->return_type).id_;
    pvVar13->physical_type_ = (pEVar12->return_type).physical_type_;
    pLVar14 = &pEVar12->return_type;
  }
  else {
    type = &pEVar11->return_type;
    if (LVar2 != UNKNOWN) {
      LogicalType::LogicalType(&local_a8);
      left = ListType::GetChildType(type);
      bVar9 = LogicalType::TryGetMaxLogicalType(context,left,pLVar14,&local_a8);
      if (!bVar9) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        local_e0 = (undefined1  [8])&aStack_d0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e0,
                   "%s: Cannot match element of type \'%s\' in a list of type \'%s\' - an explicit cast is required"
                   ,"");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar5 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name
                 ._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar5,
                   pcVar5 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                            super_Function.name._M_string_length);
        LogicalType::ToString_abi_cxx11_(&local_50,pLVar14);
        LogicalType::ToString_abi_cxx11_(&local_70,type);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this_00,(string *)local_e0,&local_90,&local_50,&local_70);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::LIST((LogicalType *)local_e0,&local_a8);
      pvVar1 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
      pvVar13 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,0);
      uVar8 = aStack_d0._M_allocated_capacity;
      peVar7 = local_d8;
      pvVar13->id_ = (LogicalTypeId)local_e0[0];
      pvVar13->physical_type_ = local_e0[1];
      uVar16 = *(undefined4 *)
                &(pvVar13->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar17 = *(undefined4 *)
                ((long)&(pvVar13->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar18 = *(undefined4 *)
                &(pvVar13->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar19 = *(undefined4 *)
                ((long)&(pvVar13->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pvVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pvVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8 = (element_type *)0x0;
      aStack_d0._M_allocated_capacity = 0;
      p_Var4 = (pvVar13->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pvVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
      (pvVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c0._8_4_ = uVar16;
        local_c0._12_4_ = uVar17;
        uStack_b0 = uVar18;
        uStack_ac = uVar19;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        uVar16 = local_c0._8_4_;
        uVar17 = local_c0._12_4_;
        uVar18 = uStack_b0;
        uVar19 = uStack_ac;
      }
      uVar8 = aStack_d0._M_allocated_capacity;
      local_d8 = (element_type *)CONCAT44(uVar17,uVar16);
      aStack_d0._M_allocated_capacity._4_4_ = uVar19;
      aStack_d0._M_allocated_capacity._0_4_ = uVar18;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
      }
      LogicalType::~LogicalType((LogicalType *)local_e0);
      pvVar13 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,1);
      if (pvVar13 != &local_a8) {
        pvVar13->id_ = local_a8.id_;
        pvVar13->physical_type_ = local_a8.physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar13->type_info_,&local_a8.type_info_);
      }
      LogicalType::~LogicalType(&local_a8);
      goto LAB_00910dfe;
    }
    pvVar1 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar13 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,0);
    if (pvVar13 != type) {
      pvVar13->id_ = (pEVar11->return_type).id_;
      pvVar13->physical_type_ = (pEVar11->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar13->type_info_,&(pEVar11->return_type).type_info_);
    }
    pLVar14 = ListType::GetChildType(type);
    pvVar13 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,1);
    if (pvVar13 == pLVar14) goto LAB_00910dfe;
    pvVar13->id_ = pLVar14->id_;
    pvVar13->physical_type_ = pLVar14->physical_type_;
  }
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar13->type_info_,&pLVar14->type_info_);
LAB_00910dfe:
  puVar15 = (undefined8 *)operator_new(0x20);
  LogicalType::LogicalType
            ((LogicalType *)local_e0,&(bound_function->super_BaseScalarFunction).return_type);
  *puVar15 = &PTR__VariableReturnBindData_01982b48;
  LogicalType::LogicalType((LogicalType *)(puVar15 + 1),(LogicalType *)local_e0);
  LogicalType::~LogicalType((LogicalType *)local_e0);
  *(undefined8 **)this = puVar15;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListSearchBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	// If the first argument is an array, cast it to a list
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	const auto &list = arguments[0]->return_type;
	const auto &value = arguments[1]->return_type;

	const auto list_is_param = list.id() == LogicalTypeId::UNKNOWN;
	const auto value_is_param = value.id() == LogicalTypeId::UNKNOWN;

	if (list_is_param) {
		if (!value_is_param) {
			// only list is a parameter, cast it to a list of value type
			bound_function.arguments[0] = LogicalType::LIST(value);
			bound_function.arguments[1] = value;
		}
	} else if (value_is_param) {
		// only value is a parameter: we expect the child type of list
		bound_function.arguments[0] = list;
		bound_function.arguments[1] = ListType::GetChildType(list);
	} else {
		LogicalType max_child_type;
		if (!LogicalType::TryGetMaxLogicalType(context, ListType::GetChildType(list), value, max_child_type)) {
			throw BinderException(
			    "%s: Cannot match element of type '%s' in a list of type '%s' - an explicit cast is required",
			    bound_function.name, value.ToString(), list.ToString());
		}

		bound_function.arguments[0] = LogicalType::LIST(max_child_type);
		bound_function.arguments[1] = max_child_type;
	}
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}